

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::createMemorySizeFunctions(MultiMemoryLowering *this)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  Name memoryName;
  value_type *local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> function;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    puVar1 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->wasm->memories).
                      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3)
    break;
    memoryName.super_IString.str._M_str =
         *(char **)puVar1[uVar3]._M_t.
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    memoryName.super_IString.str._M_len = uVar3;
    memorySize((MultiMemoryLowering *)&stack0xffffffffffffffd0,(Index)this,memoryName);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back(&this->memorySizeNames,local_30)
    ;
    Module::addFunction(this->wasm,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &stack0xffffffffffffffd0);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &stack0xffffffffffffffd0);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void createMemorySizeFunctions() {
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto function = memorySize(i, wasm->memories[i]->name);
      memorySizeNames.push_back(function->name);
      wasm->addFunction(std::move(function));
    }
  }